

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

float find_max_RGBE(uchar *image,int width,int height)

{
  double dVar1;
  int local_30;
  float scale;
  int j;
  int i;
  uchar *img;
  float max_val;
  int height_local;
  int width_local;
  uchar *image_local;
  
  img._4_4_ = 0.0;
  _j = image;
  for (scale = (float)(width * height); 0 < (int)scale; scale = (float)((int)scale + -1)) {
    dVar1 = ldexp(0.003921568859368563,_j[3] - 0x80);
    for (local_30 = 0; local_30 < 3; local_30 = local_30 + 1) {
      if (img._4_4_ < (float)_j[local_30] * (float)dVar1) {
        img._4_4_ = (float)_j[local_30] * (float)dVar1;
      }
    }
    _j = _j + 4;
  }
  return img._4_4_;
}

Assistant:

float
find_max_RGBE
(
	unsigned char *image,
    int width, int height
)
{
	float max_val = 0.0f;
	unsigned char *img = image;
	int i, j;
	for( i = width * height; i > 0; --i )
	{
		/* float scale = powf( 2.0f, img[3] - 128.0f ) / 255.0f; */
		float scale = ldexp( 1.0f / 255.0f, (int)(img[3]) - 128 );
		for( j = 0; j < 3; ++j )
		{
			if( img[j] * scale > max_val )
			{
				max_val = img[j] * scale;
			}
		}
		/* next pixel */
		img += 4;
	}
	return max_val;
}